

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEAngle.cpp
# Opt level: O0

bool __thiscall test_CEAngle::runtests(test_CEAngle *this)

{
  byte bVar1;
  long *in_RDI;
  test_CEAngle *in_stack_000001f0;
  test_CEAngle *in_stack_000004a0;
  test_CEAngle *in_stack_00000f60;
  
  std::operator<<((ostream *)&std::cout,"\nTesting CEAngle:\n");
  test_construct(in_stack_000001f0);
  test_setangle(in_stack_000004a0);
  test_retrieve(in_stack_00000f60);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEAngle::runtests()
{
    std::cout << "\nTesting CEAngle:\n";

    // Run each of the tests
    test_construct();
    test_setangle();
    test_retrieve();

    return pass();
}